

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  u64 local_60;
  i64 nCellKey;
  u8 *pCell;
  MemPage *pPage;
  Pgno chldPg;
  int c;
  int idx;
  int upr;
  int lwr;
  int rc;
  int *pRes_local;
  i64 iStack_20;
  int biasRight_local;
  i64 intKey_local;
  BtCursor *pCur_local;
  
  _lwr = pRes;
  pRes_local._4_4_ = biasRight;
  iStack_20 = intKey;
  intKey_local = (i64)pCur;
  if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
    if ((pCur->info).nKey == intKey) {
      *pRes = 0;
      return 0;
    }
    if ((pCur->info).nKey < intKey) {
      if ((pCur->curFlags & 8) != 0) {
        *pRes = -1;
        return 0;
      }
      if ((pCur->info).nKey + 1 == intKey) {
        *pRes = 0;
        upr = sqlite3BtreeNext(pCur,0);
        if (upr == 0) {
          getCellInfo((BtCursor *)intKey_local);
          if (*(long *)(intKey_local + 0x30) == iStack_20) {
            return 0;
          }
        }
        else if (upr != 0x65) {
          return upr;
        }
      }
    }
  }
  pCur_local._4_4_ = moveToRoot((BtCursor *)intKey_local);
  if (pCur_local._4_4_ != 0) {
    if (pCur_local._4_4_ == 0x10) {
      *_lwr = -1;
      pCur_local._4_4_ = 0;
    }
    return pCur_local._4_4_;
  }
LAB_0015faa0:
  upr = 0;
  pCell = *(u8 **)(intKey_local + 0x88);
  idx = 0;
  c = *(ushort *)(pCell + 0x18) - 1;
  chldPg = c >> (1U - (char)pRes_local._4_4_ & 0x1f);
  do {
    nCellKey = *(long *)(pCell + 0x68) +
               (long)(int)(uint)(*(ushort *)(pCell + 0x1a) &
                                CONCAT11(*(undefined1 *)
                                          (*(long *)(pCell + 0x60) + (long)(int)(chldPg << 1)),
                                         *(undefined1 *)
                                          (*(long *)(pCell + 0x60) + 1 + (long)(int)(chldPg << 1))))
    ;
    if (pCell[2] != '\0') {
      while (uVar3 = nCellKey + 1, bVar1 = *(byte *)nCellKey, nCellKey = uVar3, 0x7f < bVar1) {
        if (*(ulong *)(pCell + 0x58) <= uVar3) {
          iVar2 = sqlite3CorruptError(0x11b3b);
          return iVar2;
        }
      }
    }
    sqlite3GetVarint((uchar *)nCellKey,&local_60);
    if ((long)local_60 < iStack_20) {
      idx = chldPg + 1;
      if (c < idx) {
        pPage._4_4_ = -1;
        goto LAB_0015fc34;
      }
    }
    else {
      if ((long)local_60 <= iStack_20) {
        *(short *)(intKey_local + 0x56) = (short)chldPg;
        if (pCell[8] != '\0') {
          *(byte *)(intKey_local + 1) = *(byte *)(intKey_local + 1) | 2;
          *(u64 *)(intKey_local + 0x30) = local_60;
          *(undefined2 *)(intKey_local + 0x46) = 0;
          *_lwr = 0;
          return 0;
        }
        idx = chldPg;
        goto LAB_0015fc63;
      }
      c = chldPg - 1;
      if (c < idx) break;
    }
    chldPg = idx + c >> 1;
  } while( true );
  pPage._4_4_ = 1;
LAB_0015fc34:
  if (pCell[8] != '\0') {
    *(short *)(intKey_local + 0x56) = (short)chldPg;
    *_lwr = pPage._4_4_;
    upr = 0;
    goto LAB_0015fd0d;
  }
LAB_0015fc63:
  if (idx < (int)(uint)*(ushort *)(pCell + 0x18)) {
    pPage._0_4_ = sqlite3Get4byte((u8 *)(*(long *)(pCell + 0x50) +
                                        (long)(int)(uint)(*(ushort *)(pCell + 0x1a) &
                                                         CONCAT11(*(undefined1 *)
                                                                   (*(long *)(pCell + 0x60) +
                                                                   (long)(idx << 1)),
                                                                  *(undefined1 *)
                                                                   (*(long *)(pCell + 0x60) + 1 +
                                                                   (long)(idx << 1))))));
  }
  else {
    pPage._0_4_ = sqlite3Get4byte((u8 *)(*(long *)(pCell + 0x50) + (long)(int)(pCell[9] + 8)));
  }
  *(short *)(intKey_local + 0x56) = (short)idx;
  upr = moveToChild((BtCursor *)intKey_local,(u32)pPage);
  if (upr != 0) {
LAB_0015fd0d:
    *(undefined2 *)(intKey_local + 0x46) = 0;
    return upr;
  }
  goto LAB_0015faa0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}